

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCheckerTester.cpp
# Opt level: O2

void __thiscall psy::C::TypeCheckerTester::case0247(TypeCheckerTester *this)

{
  Expectation *pEVar1;
  allocator<char> local_1b9;
  string local_1b8;
  string local_198;
  Expectation local_178;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"\nvoid _ ()\n{\n    int * x ;\n    x > 0 ;\n}\n",&local_1b9);
  Expectation::Expectation(&local_178);
  std::__cxx11::string::string
            ((string *)&local_1b8,
             (string *)&TypeChecker::DiagnosticsReporter::ID_of_InvalidOperator_abi_cxx11_);
  pEVar1 = Expectation::diagnostic(&local_178,Error,&local_1b8);
  Expectation::Expectation(&local_c0,pEVar1);
  checkTypes(this,&local_198,&local_c0);
  Expectation::~Expectation(&local_c0);
  std::__cxx11::string::~string((string *)&local_1b8);
  Expectation::~Expectation(&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  return;
}

Assistant:

void TypeCheckerTester::case0247()
{
    auto s = R"(
void _ ()
{
    int * x ;
    x > 0 ;
}
)";

    checkTypes(s,
               Expectation()
                  .diagnostic(Expectation::ErrorOrWarn::Error,
                              TypeChecker::DiagnosticsReporter::ID_of_InvalidOperator));
}